

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON_writer.hh
# Opt level: O2

Writer * __thiscall JSON::Writer::writeBase64(Writer *this,string_view sv)

{
  size_t __n;
  Pl_Base64 base;
  Pl_Concatenate cat;
  Pl_Base64 local_a0;
  Pl_Concatenate local_58;
  
  Pl_Concatenate::Pl_Concatenate(&local_58,"writer concat",this->p);
  __n = 0;
  Pl_Base64::Pl_Base64(&local_a0,"writer base64",&local_58.super_Pipeline,a_encode);
  Pl_Base64::write(&local_a0,(int)sv._M_str,(void *)sv._M_len,__n);
  Pl_Base64::finish(&local_a0);
  Pipeline::~Pipeline(&local_a0.super_Pipeline);
  Pl_Concatenate::~Pl_Concatenate(&local_58);
  return this;
}

Assistant:

Writer&
    writeBase64(std::string_view sv)
    {
        Pl_Concatenate cat{"writer concat", p};
        Pl_Base64 base{"writer base64", &cat, Pl_Base64::a_encode};
        base.write(reinterpret_cast<unsigned char const*>(sv.data()), sv.size());
        base.finish();
        return *this;
    }